

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyIdSet.h
# Opt level: O3

void __thiscall Rml::PropertyIdSet::Insert(PropertyIdSet *this,PropertyId id)

{
  ulong *puVar1;
  code *pcVar2;
  bool bVar3;
  
  if (-1 < (char)id) {
    puVar1 = (ulong *)((long)(this->defined_ids).super__Base_bitset<2UL>._M_w +
                      (ulong)(id >> 3 & 0x18));
    *puVar1 = *puVar1 | 1L << (id & OverscrollBehavior);
    return;
  }
  bVar3 = Assert("RMLUI_ASSERT(size_t(id) < N)",
                 "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/../../Include/RmlUi/Core/PropertyIdSet.h"
                 ,0x39);
  if (bVar3) {
    ::std::__throw_out_of_range_fmt
              ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",(ulong)id,0x80);
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void Insert(PropertyId id)
	{
		RMLUI_ASSERT(size_t(id) < N);
		defined_ids.set((size_t)id);
	}